

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O2

void __thiscall
mahjong::PatternComputer::compute
          (PatternComputer *this,WiningPatterns *out_patterns,WiningHand *out_wining_hand)

{
  pointer hand;
  WiningHandCollator c;
  WiningHands local_90;
  vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_> local_78;
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  local_60;
  
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::clear(&(this->highest_patterns)._M_t);
  local_78.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WiningHandCollator::collate(&local_90,(WiningHandCollator *)&local_78,this->hand);
  for (hand = local_90.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>
              ._M_impl.super__Vector_impl_data._M_start;
      hand != local_90.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>
              ._M_impl.super__Vector_impl_data._M_finish; hand = hand + 1) {
    resetRecognizer(this);
    check(this,hand);
    recognize((WiningPatterns *)&local_60,this);
    setHighest(this,hand,(WiningPatterns *)&local_60);
    std::
    _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
    ::~_Rb_tree(&local_60);
  }
  std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>::~vector(&local_90);
  special(this,this->hand);
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::operator=(&out_patterns->_M_t,&(this->highest_patterns)._M_t);
  WiningHand::operator=(out_wining_hand,&this->highest_wining_hand);
  std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>::~vector(&local_78);
  return;
}

Assistant:

void PatternComputer::compute(WiningPatterns& out_patterns, WiningHand& out_wining_hand)
{
	highest_patterns.clear();

	WiningHandCollator c;
	for (const auto& h : c.collate(hand))
	{
		resetRecognizer();

		check(h);

		const auto& patterns = recognize();
		setHighest(h, patterns);
	}

	special(hand);

	out_patterns = highest_patterns;
	out_wining_hand = highest_wining_hand;
}